

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportTableSet(TranslateToFuzzReader *this,Type type)

{
  string_view target;
  Call *pCVar1;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_60;
  Expression *local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  allocator_type local_31;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4e8,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
  }
  if ((this->tableSetImportName).super_IString.str._M_str != (char *)0x0) {
    target = (this->tableSetImportName).super_IString.str;
    local_60 = make(this,(Type)0x2);
    local_58 = makeBasicRef(this,(Type)0x12);
    __l._M_len = 2;
    __l._M_array = &local_60;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_50,__l,&local_31);
    pCVar1 = Builder::makeCall(&this->builder,(Name)target,&local_50,(Type)0x0,false);
    if (local_50.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (Expression *)pCVar1;
  }
  __assert_fail("tableSetImportName",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4e9,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableSet(Type type) {
  assert(type == Type::none);
  assert(tableSetImportName);
  return builder.makeCall(
    tableSetImportName,
    {make(Type::i32), makeBasicRef(Type(HeapType::func, Nullable))},
    Type::none);
}